

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# equality.cpp
# Opt level: O2

void __thiscall
Equality_unitsNotEqualDifferingOrderOfUnits_Test::Equality_unitsNotEqualDifferingOrderOfUnits_Test
          (Equality_unitsNotEqualDifferingOrderOfUnits_Test *this)

{
  testing::Test::Test(&this->super_Test);
  *(undefined ***)this = &PTR__Test_0012db38;
  return;
}

Assistant:

TEST(Equality, unitsNotEqualDifferingOrderOfUnits)
{
    libcellml::UnitsPtr u1 = libcellml::Units::create("unitsA");
    libcellml::UnitsPtr u2 = libcellml::Units::create("unitsA");

    u1->addUnit("metre", 3.0);
    u1->addUnit("second", 1.0, "unit_id");
    u2->addUnit("second", 2.0, "unit_id");
    u2->addUnit("metre", 3.0);

    EXPECT_FALSE(u1->equals(u2));
    EXPECT_FALSE(u2->equals(u1));
}